

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O0

void __thiscall UniqueList<GLSkyInfo>::Clear(UniqueList<GLSkyInfo> *this)

{
  uint uVar1;
  GLSkyInfo **ppGVar2;
  uint local_14;
  uint i;
  UniqueList<GLSkyInfo> *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<GLSkyInfo_*,_GLSkyInfo_*>::Size(&this->Array);
    if (uVar1 <= local_14) break;
    ppGVar2 = TArray<GLSkyInfo_*,_GLSkyInfo_*>::operator[](&this->Array,(ulong)local_14);
    FreeList<GLSkyInfo>::Release((FreeList<GLSkyInfo> *)&this->field_0x10,*ppGVar2);
    local_14 = local_14 + 1;
  }
  TArray<GLSkyInfo_*,_GLSkyInfo_*>::Clear(&this->Array);
  return;
}

Assistant:

void Clear()
	{
		for(unsigned i=0;i<Array.Size();i++) TheFreeList.Release(Array[i]);
		Array.Clear();
	}